

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

Texture * __thiscall rw::defaultReadCB(rw *this,char *name,char *mask)

{
  Image *image;
  Raster *raster;
  Image *img;
  Texture *tex;
  char *mask_local;
  char *name_local;
  
  image = Image::readMasked((Image *)this,name,mask);
  if (image == (Image *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    raster = Raster::createFromImage(image,0);
    name_local = (char *)Texture::create(raster);
    strncpy(((Texture *)name_local)->name,(char *)this,0x20);
    if (name != (char *)0x0) {
      strncpy(((Texture *)name_local)->mask,name,0x20);
    }
    Image::destroy(image);
  }
  return (Texture *)name_local;
}

Assistant:

static Texture*
defaultReadCB(const char *name, const char *mask)
{
	Texture *tex;
	Image *img;

	img = Image::readMasked(name, mask);
	if(img){
		tex = Texture::create(Raster::createFromImage(img));
		strncpy(tex->name, name, 32);
		if(mask)
			strncpy(tex->mask, mask, 32);
		img->destroy();
		return tex;
	}else
		return nil;
}